

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O3

void __thiscall
cmExtraEclipseCDT4Generator::CreateSourceProjectFile(cmExtraEclipseCDT4Generator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t __n;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  string filename;
  string name;
  cmGeneratedFileStream fout;
  string local_2c8;
  string local_2a8;
  string local_288;
  undefined1 local_268 [32];
  byte abStack_248 [552];
  
  __n = (this->HomeDirectory)._M_string_length;
  if (__n == (this->HomeOutputDirectory)._M_string_length) {
    if (__n != 0) {
      iVar3 = bcmp((this->HomeDirectory)._M_dataplus._M_p,
                   (this->HomeOutputDirectory)._M_dataplus._M_p,__n);
      if (iVar3 != 0) goto LAB_00354203;
    }
    __assert_fail("this->HomeDirectory != this->HomeOutputDirectory",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmExtraEclipseCDT4Generator.cxx"
                  ,0x9d,"void cmExtraEclipseCDT4Generator::CreateSourceProjectFile()");
  }
LAB_00354203:
  cmLocalGenerator::GetProjectName_abi_cxx11_
            ((string *)local_268,
             *(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start);
  paVar1 = &local_2c8.field_2;
  local_2c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"Source","");
  GetPathBasename(&local_2a8,&this->HomeDirectory);
  GenerateProjectName(&local_288,(string *)local_268,&local_2c8,&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  pcVar2 = (this->HomeDirectory)._M_dataplus._M_p;
  local_2c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,pcVar2,pcVar2 + (this->HomeDirectory)._M_string_length);
  std::__cxx11::string::append((char *)&local_2c8);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_268,local_2c8._M_dataplus._M_p,false);
  if ((abStack_248[*(long *)(local_268._0_8_ + -0x18)] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_268,
               "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<projectDescription>\n\t<name>",0x43);
    EscapeForXML(&local_2a8,&local_288);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_268,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,
               "</name>\n\t<comment></comment>\n\t<projects>\n\t</projects>\n\t<buildSpec>\n\t</buildSpec>\n\t<natures>\n\t</natures>\n\t<linkedResources>\n"
               ,0x7b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if (this->SupportsVirtualFolders == true) {
      CreateLinksToSubprojects(this,(cmGeneratedFileStream *)local_268,&this->HomeDirectory);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&this->SrcLinkedResources,
                        (this->SrcLinkedResources).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_268,"\t</linkedResources>\n</projectDescription>\n",0x2a);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateSourceProjectFile()
{
  assert(this->HomeDirectory != this->HomeOutputDirectory);

  // set up the project name: <project>-Source@<baseSourcePathName>
  cmLocalGenerator* lg = this->GlobalGenerator->GetLocalGenerators()[0];
  std::string name = this->GenerateProjectName(lg->GetProjectName(), "Source",
                                   this->GetPathBasename(this->HomeDirectory));

  const std::string filename = this->HomeDirectory + "/.project";
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout)
    {
    return;
    }

  fout <<
    "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
    "<projectDescription>\n"
    "\t<name>" << this->EscapeForXML(name) << "</name>\n"
    "\t<comment></comment>\n"
    "\t<projects>\n"
    "\t</projects>\n"
    "\t<buildSpec>\n"
    "\t</buildSpec>\n"
    "\t<natures>\n"
    "\t</natures>\n"
    "\t<linkedResources>\n";

  if (this->SupportsVirtualFolders)
    {
    this->CreateLinksToSubprojects(fout, this->HomeDirectory);
    this->SrcLinkedResources.clear();
    }

  fout <<
    "\t</linkedResources>\n"
    "</projectDescription>\n"
    ;
}